

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O2

Log * __thiscall FIX::FileLogFactory::create(FileLogFactory *this)

{
  Dictionary *this_00;
  int iVar1;
  bool bVar2;
  FileLog *this_01;
  string backupPath;
  string path;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  iVar1 = this->m_globalLogCount;
  this->m_globalLogCount = iVar1 + 1;
  if (iVar1 < 1) {
    if ((this->m_path)._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"FileLogPath",(allocator<char> *)&local_88);
      this_00 = &(this->m_settings).m_defaults;
      Dictionary::getString(&local_48,this_00,&local_a8,false);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::string((string *)&local_a8,(string *)&local_48);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"FileLogBackupPath",(allocator<char> *)&local_68);
      bVar2 = Dictionary::has(this_00,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"FileLogBackupPath",&local_a9);
        Dictionary::getString(&local_88,this_00,&local_68,false);
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_68);
      }
      this_01 = (FileLog *)operator_new(0x488);
      FileLog::FileLog(this_01,&local_48,&local_a8);
      this->m_globalLog = (Log *)this_01;
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_48);
    }
    else {
      this_01 = (FileLog *)operator_new(0x488);
      FileLog::FileLog(this_01,&this->m_path);
    }
  }
  else {
    this_01 = (FileLog *)this->m_globalLog;
  }
  return &this_01->super_Log;
}

Assistant:

Log* FileLogFactory::create()
{
  if ( ++m_globalLogCount > 1 ) return m_globalLog;

  if ( m_path.size() ) return new FileLog(m_path);

  try
  {

    const Dictionary& settings = m_settings.get();
    std::string path = settings.getString(FILE_LOG_PATH);
    std::string backupPath = path;

    if ( settings.has( FILE_LOG_BACKUP_PATH ) )
      backupPath = settings.getString( FILE_LOG_BACKUP_PATH );

    return m_globalLog = new FileLog( path, backupPath );

  }
  catch( ConfigError& )
  {
    m_globalLogCount--;
    throw;
  }
}